

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O1

void __thiscall QRhiWidgetPrivate::releaseResources(QRhiWidgetPrivate *this)

{
  long lVar1;
  QRhiResource **ppQVar2;
  long *plVar3;
  long lVar4;
  
  resetRenderTargetObjects(this);
  resetColorBufferObjects(this);
  lVar1 = (this->pendingDeletes).d.size;
  if (lVar1 != 0) {
    ppQVar2 = (this->pendingDeletes).d.ptr;
    lVar4 = 0;
    do {
      plVar3 = *(long **)((long)ppQVar2 + lVar4);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))();
      }
      lVar4 = lVar4 + 8;
    } while (lVar1 << 3 != lVar4);
  }
  QList<QRhiResource_*>::clear(&this->pendingDeletes);
  return;
}

Assistant:

void QRhiWidgetPrivate::releaseResources()
{
    resetRenderTargetObjects();
    resetColorBufferObjects();
    qDeleteAll(pendingDeletes);
    pendingDeletes.clear();
}